

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
::
insert_iterator_multi<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>const,std::pair<std::pair<int,int>const,std::pair<int,int>>const&,std::pair<std::pair<int,int>const,std::pair<int,int>>const*>>
          (btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
           *this,btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
                 b,btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
                   e)

{
  reference v;
  ulong uVar1;
  iterator position;
  iterator iVar2;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
  local_40;
  
  local_40.node = b.node;
  local_40.position = b.position;
  uVar1 = b._8_8_;
  while ((local_40.node != e.node || ((int)uVar1 != e.position))) {
    iVar2 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
            ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   *)this);
    v = btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
        ::operator*(&local_40);
    position._12_4_ = 0;
    position.node =
         (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
          *)SUB128(iVar2._0_12_,0);
    position.position = SUB124(iVar2._0_12_,8);
    insert_hint_multi<std::pair<std::pair<int,int>const,std::pair<int,int>>const&>(this,position,v);
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
    ::increment(&local_40);
    uVar1 = (ulong)(uint)local_40.position;
  }
  return;
}

Assistant:

void btree<P>::insert_iterator_multi(InputIterator b, InputIterator e) {
        for (; b != e; ++b) {
            insert_hint_multi(end(), *b);
        }
    }